

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_main.c
# Opt level: O1

void glob_path_dialog(t_pd *dummy,t_symbol *s,int argc,t_atom *argv)

{
  t_symbol *ptVar1;
  t_namelist *ptVar2;
  int which;
  t_float tVar3;
  
  namelist_free((pd_maininstance.pd_stuff)->st_searchpath);
  (pd_maininstance.pd_stuff)->st_searchpath = (t_namelist *)0x0;
  tVar3 = atom_getfloatarg(0,argc,argv);
  sys_usestdpath = (int)tVar3;
  tVar3 = atom_getfloatarg(1,argc,argv);
  sys_verbose = (int)tVar3;
  if (2 < argc) {
    which = 2;
    do {
      ptVar1 = atom_getsymbolarg(which,argc,argv);
      ptVar1 = sys_decodedialog(ptVar1);
      if (*ptVar1->s_name != '\0') {
        ptVar2 = namelist_append_files((pd_maininstance.pd_stuff)->st_searchpath,ptVar1->s_name);
        (pd_maininstance.pd_stuff)->st_searchpath = ptVar2;
      }
      which = which + 1;
    } while (argc != which);
  }
  return;
}

Assistant:

void glob_path_dialog(t_pd *dummy, t_symbol *s, int argc, t_atom *argv)
{
    int i;
    namelist_free(STUFF->st_searchpath);
    STUFF->st_searchpath = 0;
    sys_usestdpath = atom_getfloatarg(0, argc, argv);
    sys_verbose = atom_getfloatarg(1, argc, argv);
    for (i = 0; i < argc-2; i++)
    {
        t_symbol *s = sys_decodedialog(atom_getsymbolarg(i+2, argc, argv));
        if (*s->s_name)
            STUFF->st_searchpath =
                namelist_append_files(STUFF->st_searchpath, s->s_name);
    }
}